

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<unsigned_int,_unsigned_int>::tbbRadixIteration1
          (ParallelRadixSort<unsigned_int,_unsigned_int> *this,uint shift,uint *src,uint *dst,
          size_t threadIndex,size_t threadCount)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [276];
  
  lVar3 = *(long *)(this + 0x18);
  lVar14 = 0;
  memset(local_880 + 0x100,0,0x400);
  uVar7 = (lVar3 * threadIndex) / threadCount;
  lVar8 = *(long *)this;
  lVar10 = lVar8;
  do {
    uVar13 = 0xfffffffffffffffc;
    do {
      piVar1 = (int *)(lVar10 + 0x10 + uVar13 * 4);
      iVar4 = piVar1[1];
      iVar5 = piVar1[2];
      iVar6 = piVar1[3];
      local_880[uVar13 + 0x104] = *piVar1 + local_880[uVar13 + 0x104];
      local_880[uVar13 + 0x105] = iVar4 + local_880[uVar13 + 0x105];
      local_880[uVar13 + 0x106] = iVar5 + local_880[uVar13 + 0x106];
      local_880[uVar13 + 0x107] = iVar6 + local_880[uVar13 + 0x107];
      uVar13 = uVar13 + 4;
    } while (uVar13 < 0xfc);
    lVar14 = lVar14 + 1;
    lVar10 = lVar10 + 0x400;
  } while (lVar14 != threadCount + (threadCount == 0));
  local_880[0] = 0;
  lVar10 = 1;
  uVar9 = 0;
  do {
    uVar9 = uVar9 + local_880[lVar10 + 0xff];
    local_880[lVar10] = uVar9;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100);
  if (threadIndex != 0) {
    sVar11 = 0;
    do {
      uVar13 = 0xfffffffffffffffc;
      do {
        piVar1 = (int *)(lVar8 + 0x10 + uVar13 * 4);
        iVar4 = piVar1[1];
        iVar5 = piVar1[2];
        iVar6 = piVar1[3];
        local_880[uVar13 + 4] = *piVar1 + local_880[uVar13 + 4];
        local_880[uVar13 + 5] = iVar4 + local_880[uVar13 + 5];
        local_880[uVar13 + 6] = iVar5 + local_880[uVar13 + 6];
        local_880[uVar13 + 7] = iVar6 + local_880[uVar13 + 7];
        uVar13 = uVar13 + 4;
      } while (uVar13 < 0xfc);
      sVar11 = sVar11 + 1;
      lVar8 = lVar8 + 0x400;
    } while (sVar11 != threadIndex);
  }
  for (; uVar7 < ((threadIndex + 1) * lVar3) / threadCount; uVar7 = uVar7 + 1) {
    uVar9 = src[uVar7];
    bVar12 = (byte)(uVar9 >> ((byte)shift & 0x3f));
    uVar2 = local_880[bVar12];
    local_880[bVar12] = uVar2 + 1;
    dst[uVar2] = uVar9;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }